

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O3

xmlRelaxNGValidCtxtPtr xmlRelaxNGNewValidCtxt(xmlRelaxNGPtr schema)

{
  xmlRelaxNGValidCtxtPtr __s;
  
  __s = (xmlRelaxNGValidCtxtPtr)(*xmlMalloc)(0xc0);
  if (__s == (xmlRelaxNGValidCtxtPtr)0x0) {
    xmlRaiseMemoryError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,0x13,
                        (xmlError *)0x0);
  }
  else {
    memset(__s,0,0xc0);
    __s->schema = schema;
    __s->err = (xmlRelaxNGValidErrorPtr)0x0;
    __s->errNr = 0;
    __s->errMax = 0;
    __s->errTab = (xmlRelaxNGValidErrorPtr)0x0;
    if (schema != (xmlRelaxNGPtr)0x0) {
      __s->idref = schema->idref;
    }
    __s->freeStates = (xmlRelaxNGStatesPtr *)0x0;
    __s->errNo = 0;
    __s->states = (xmlRelaxNGStatesPtr)0x0;
    __s->freeState = (xmlRelaxNGStatesPtr)0x0;
  }
  return __s;
}

Assistant:

xmlRelaxNGValidCtxtPtr
xmlRelaxNGNewValidCtxt(xmlRelaxNGPtr schema)
{
    xmlRelaxNGValidCtxtPtr ret;

    ret = (xmlRelaxNGValidCtxtPtr) xmlMalloc(sizeof(xmlRelaxNGValidCtxt));
    if (ret == NULL) {
        xmlRngVErrMemory(NULL);
        return (NULL);
    }
    memset(ret, 0, sizeof(xmlRelaxNGValidCtxt));
    ret->schema = schema;
    ret->errNr = 0;
    ret->errMax = 0;
    ret->err = NULL;
    ret->errTab = NULL;
    if (schema != NULL)
	ret->idref = schema->idref;
    ret->states = NULL;
    ret->freeState = NULL;
    ret->freeStates = NULL;
    ret->errNo = XML_RELAXNG_OK;
    return (ret);
}